

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O1

int32_t floatx80_to_int32_mipsel(floatx80 a,float_status *status)

{
  byte zSign;
  int32_t iVar1;
  ushort uVar2;
  int iVar3;
  uint64_t absZ;
  ulong uVar4;
  
  uVar4 = a.low;
  uVar2 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar4)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    return -0x80000000;
  }
  zSign = 0;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
    zSign = a.high._1_1_ >> 7;
  }
  if (uVar2 != 0x7fff) {
    zSign = a.high._1_1_ >> 7;
  }
  if (uVar2 < 0x3ff8) {
    absZ = (uint64_t)(uVar4 != 0);
  }
  else {
    iVar3 = 1;
    if (1 < (int)(0x4037 - (uint)uVar2)) {
      iVar3 = 0x4037 - (uint)uVar2;
    }
    absZ = (ulong)(uVar4 << (-(byte)iVar3 & 0x3f) != 0) | uVar4 >> ((byte)iVar3 & 0x3f);
  }
  iVar1 = roundAndPackInt32(zSign,absZ,status);
  return iVar1;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}